

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

ExtensionSet * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetExtensionSet
          (GeneratedMessageReflection *this,Message *message)

{
  int iVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = this->extensions_offset_;
  if (iVar1 == -1) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x4ae);
    other = LogMessage::operator<<(&local_50,"CHECK failed: (extensions_offset_) != (-1): ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
    iVar1 = this->extensions_offset_;
  }
  return (ExtensionSet *)((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar1);
}

Assistant:

inline const ExtensionSet& GeneratedMessageReflection::GetExtensionSet(
    const Message& message) const {
  GOOGLE_DCHECK_NE(extensions_offset_, -1);
  const void* ptr = reinterpret_cast<const uint8*>(&message) +
                    extensions_offset_;
  return *reinterpret_cast<const ExtensionSet*>(ptr);
}